

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_field_sqrt(void *arg,int iters)

{
  secp256k1_fe *r;
  int iVar1;
  int iVar2;
  int iVar3;
  secp256k1_fe t;
  secp256k1_fe local_58;
  
  r = (secp256k1_fe *)((long)arg + 0x40);
  iVar2 = 0;
  iVar3 = 0;
  if (0 < iters) {
    iVar3 = iters;
  }
  while (iVar3 != 0) {
    local_58.n[4] = *(uint64_t *)((long)arg + 0x60);
    local_58.n[0] = r->n[0];
    local_58.n[1] = *(uint64_t *)((long)arg + 0x48);
    local_58.n[2] = *(uint64_t *)((long)arg + 0x50);
    local_58.n[3] = *(uint64_t *)((long)arg + 0x58);
    iVar1 = secp256k1_fe_sqrt(r,&local_58);
    iVar2 = iVar2 + iVar1;
    secp256k1_fe_impl_add(r,(secp256k1_fe *)((long)arg + 0x68));
    iVar3 = iVar3 + -1;
  }
  if (iters < iVar2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench_internal.c"
            ,0xfa,"test condition failed: j <= iters");
    abort();
  }
  return;
}

Assistant:

static void bench_field_sqrt(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_fe t;

    for (i = 0; i < iters; i++) {
        t = data->fe[0];
        j += secp256k1_fe_sqrt(&data->fe[0], &t);
        secp256k1_fe_add(&data->fe[0], &data->fe[1]);
    }
    CHECK(j <= iters);
}